

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.hpp
# Opt level: O3

string * __thiscall
yactfr::internal::ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>>::toStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Size indent)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  Size indent_00;
  _Rb_tree_node_base *p_Var3;
  ostringstream ss;
  string local_1e0;
  string *local_1c0;
  void *local_1b8;
  Size local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1b0 = indent;
  indent_abi_cxx11_(&local_1e0,(internal *)indent,indent_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<var opt>",9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = *(_Rb_tree_node_base **)(*this + 0x70);
  p_Var3 = (_Rb_tree_node_base *)(*this + 0x60);
  local_1b8 = this;
  if (p_Var2 != p_Var3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != p_Var3);
  }
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  poVar1 = (ostream *)std::ostream::flush();
  Proc::toStr_abi_cxx11_(&local_1e0,(Proc *)((long)local_1b8 + 8),local_1b0 + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1c0;
}

Assistant:

std::string toStr(const Size indent = 0) const
    {
        std::ostringstream ss;

        ss << internal::indent(indent) << "<var opt>";

        for (const auto& range : _opt->selectorRanges()) {
            ss << " [" << range.lower() << ", " << range.upper() << "]";
        }

        ss << std::endl << _proc.toStr(indent + 1);
        return ss.str();
    }